

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

int IoTHubTransport_MQTT_Common_DeviceMethod_Response
              (TRANSPORT_LL_HANDLE handle,METHOD_HANDLE methodId,uchar *response,size_t respSize,
              int status)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  STRING_HANDLE pSVar4;
  MQTT_MESSAGE_HANDLE msgHandle;
  LOGGER_LOG p_Var5;
  uint16_t packetId;
  
  if (methodId == (METHOD_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0xdad;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
              ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdac,1,
              "Failure: DEVICE_METHOD_INFO is NULL");
    return 0xdad;
  }
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdb1,1,
                "Failure: TRANSPORT_LL_HANDLE is NULL");
    }
    STRING_delete(*methodId);
    free(methodId);
    return 0xdb2;
  }
  pSVar4 = *methodId;
  uVar1 = (ushort)*(undefined4 *)((long)handle + 0x80);
  packetId = 1;
  if (uVar1 < 0xfffe) {
    packetId = uVar1 + 1;
  }
  *(uint16_t *)((long)handle + 0x80) = packetId;
  pcVar3 = STRING_c_str(pSVar4);
  pSVar4 = STRING_construct_sprintf("$iothub/methods/res/%d/?$rid=%s",status,pcVar3);
  if (pSVar4 == (STRING_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"publishDeviceMethodResponseMsg",0x443,1,"Failed constructing message topic.");
    }
  }
  else {
    pcVar3 = STRING_c_str(pSVar4);
    msgHandle = mqttmessage_create_in_place(packetId,pcVar3,DELIVER_AT_MOST_ONCE,response,respSize);
    if (msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"publishDeviceMethodResponseMsg",1099,1,"Failed constructing mqtt message.");
      }
    }
    else {
      iVar2 = mqtt_client_publish(*(MQTT_CLIENT_HANDLE *)((long)handle + 0x70),msgHandle);
      if (iVar2 == 0) {
        mqttmessage_destroy(msgHandle);
        STRING_delete(pSVar4);
        iVar2 = 0;
        goto LAB_0012ba78;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"publishDeviceMethodResponseMsg",0x452,1,"Failed publishing to mqtt client.");
      }
      mqttmessage_destroy(msgHandle);
    }
    STRING_delete(pSVar4);
  }
  p_Var5 = xlogging_get_log_function();
  iVar2 = 0xdbc;
  if (p_Var5 != (LOGGER_LOG)0x0) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
              ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdbb,1,
              "Failure: publishing device method response");
  }
LAB_0012ba78:
  STRING_delete(*methodId);
  free(methodId);
  return iVar2;
}

Assistant:

int IoTHubTransport_MQTT_Common_DeviceMethod_Response(TRANSPORT_LL_HANDLE handle, METHOD_HANDLE methodId, const unsigned char* response, size_t respSize, int status)
{
    int result;
    DEVICE_METHOD_INFO* dev_method_info = (DEVICE_METHOD_INFO*)methodId;
    if (dev_method_info == NULL)
    {
        LogError("Failure: DEVICE_METHOD_INFO is NULL");
        result = MU_FAILURE;
    }
    else if (handle == NULL)
    {
        LogError("Failure: TRANSPORT_LL_HANDLE is NULL");
        result = MU_FAILURE;
        STRING_delete(dev_method_info->request_id);
        free(dev_method_info);
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;
        if (publishDeviceMethodResponseMsg(transport_data, status, dev_method_info->request_id, response, respSize) != 0)
        {
            LogError("Failure: publishing device method response");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
      
        STRING_delete(dev_method_info->request_id);
        free(dev_method_info);
    }

    return result;
}